

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblebridgeutils.cpp
# Opt level: O3

bool QAccessibleBridgeUtils::performEffectiveAction(QAccessibleInterface *iface,QString *actionName)

{
  long lVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  QString *pQVar5;
  undefined4 extraout_var_00;
  bool bVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  bool success;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  long *plVar4;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (iface != (QAccessibleInterface *)0x0) {
    iVar3 = (*iface->_vptr_QAccessibleInterface[0x14])(iface,3);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(&local_58,plVar4);
      QVar9.m_data = (actionName->d).ptr;
      QVar9.m_size = (actionName->d).size;
      cVar2 = QtPrivate::QStringList_contains((QList_conflict *)local_58.data,QVar9,CaseSensitive);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
      if (cVar2 != '\0') {
        (**(code **)(*plVar4 + 0x28))(plVar4,actionName);
        bVar6 = true;
        goto LAB_00586dec;
      }
    }
    pQVar5 = QAccessibleActionInterface::increaseAction();
    lVar1 = (actionName->d).size;
    if ((lVar1 != (pQVar5->d).size) ||
       (QVar7.m_data = (actionName->d).ptr, QVar7.m_size = lVar1, QVar10.m_data = (pQVar5->d).ptr,
       QVar10.m_size = lVar1, cVar2 = QtPrivate::equalStrings(QVar7,QVar10), cVar2 == '\0')) {
      pQVar5 = QAccessibleActionInterface::decreaseAction();
      lVar1 = (actionName->d).size;
      if ((lVar1 != (pQVar5->d).size) ||
         (QVar8.m_data = (actionName->d).ptr, QVar8.m_size = lVar1, QVar11.m_data = (pQVar5->d).ptr,
         QVar11.m_size = lVar1, cVar2 = QtPrivate::equalStrings(QVar8,QVar11), cVar2 == '\0'))
      goto LAB_00586dea;
    }
    iVar3 = (*iface->_vptr_QAccessibleInterface[0x14])(iface,2);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
    if (plVar4 != (long *)0x0) {
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      (**(code **)(*plVar4 + 0x10))(&local_58,plVar4);
      (**(code **)(*plVar4 + 0x30))(&local_78,plVar4);
      ::QVariant::toDouble((bool *)&local_78);
      ::QVariant::~QVariant(&local_78);
      (**(code **)(*plVar4 + 0x28))(&local_78,plVar4);
      ::QVariant::toDouble((bool *)&local_78);
      ::QVariant::~QVariant(&local_78);
      bVar6 = false;
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_00586dec;
    }
  }
LAB_00586dea:
  bVar6 = false;
LAB_00586dec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool performEffectiveAction(QAccessibleInterface *iface, const QString &actionName)
{
    if (!iface)
        return false;
    if (performAction(iface, actionName))
        return true;
    if (actionName != QAccessibleActionInterface::increaseAction()
        && actionName != QAccessibleActionInterface::decreaseAction())
        return false;

    QAccessibleValueInterface *valueIface = iface->valueInterface();
    if (!valueIface)
        return false;
    bool success;
    const QVariant currentVariant = valueIface->currentValue();
    double stepSize = valueIface->minimumStepSize().toDouble(&success);
    if (!success || qFuzzyIsNull(stepSize)) {
        const double min = valueIface->minimumValue().toDouble(&success);
        if (!success)
            return false;
        const double max = valueIface->maximumValue().toDouble(&success);
        if (!success)
            return false;
        stepSize = (max - min) / 10;  // this is pretty arbitrary, we just need to provide something
        const int typ = currentVariant.userType();
        if (typ != QMetaType::Float && typ != QMetaType::Double) {
            // currentValue is an integer. Round it up to ensure stepping in case it was below 1
            stepSize = qCeil(stepSize);
        }
    }
    const double current = currentVariant.toDouble(&success);
    if (!success)
        return false;
    if (actionName == QAccessibleActionInterface::decreaseAction())
        stepSize = -stepSize;
    valueIface->setCurrentValue(current + stepSize);
    return true;
}